

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraphd.cpp
# Opt level: O1

int64_t __thiscall TPZGraphElTd::EqNum(TPZGraphElTd *this,TPZVec<int> *co)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int iVar4;
  
  iVar1 = ((this->super_TPZGraphEl).fGraphMesh)->fResolution;
  iVar3 = TPZGraphNode::FirstPoint(this->fConnect);
  iVar2 = *co->fStore;
  iVar4 = co->fStore[1];
  if (iVar2 < 1) {
    iVar4 = iVar4 + (int)iVar3;
  }
  else {
    iVar4 = ((iVar4 + (int)iVar3 + (iVar2 << ((byte)iVar1 & 0x1f))) -
            (int)((ulong)(iVar2 - 2) * (ulong)(iVar2 - 1) >> 1)) + 1;
  }
  return (long)iVar4;
}

Assistant:

int64_t TPZGraphElTd::EqNum(TPZVec<int> &co){
	int res = fGraphMesh->Res();
	int imax = (1<<res)+1;
	int neq = fConnect->FirstPoint() + co[1];
	for(int run=0;run<co[0];run++) neq += imax-run;
	return neq;
}